

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::piece_picker::inc_refcount
          (piece_picker *this,piece_index_t index,torrent_peer *peer)

{
  int priority;
  int iVar1;
  value_type *this_00;
  int new_priority;
  int prev_priority;
  piece_pos *p;
  torrent_peer *peer_local;
  piece_picker *this_local;
  piece_index_t index_local;
  
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)index.m_val);
  priority = piece_pos::priority(this_00,this);
  *(uint *)this_00 = *(uint *)this_00 & 0xfc000000 | (*(uint *)this_00 & 0x3ffffff) + 1 & 0x3ffffff;
  if (((this->m_dirty & 1U) == 0) && (iVar1 = piece_pos::priority(this_00,this), priority != iVar1))
  {
    if (priority == -1) {
      add(this,index);
    }
    else {
      update(this,priority,(prio_index_t)(this_00->index).m_val);
    }
  }
  return;
}

Assistant:

void piece_picker::inc_refcount(piece_index_t const index
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "inc_refcount(" << index << ")" << std::endl;
#endif
		piece_pos& p = m_piece_map[index];

#ifdef TORRENT_DEBUG_REFCOUNTS
		TORRENT_ASSERT(p.have_peers.count(peer) == 0);
		p.have_peers.insert(peer);
#else
		TORRENT_UNUSED(peer);
#endif

		int prev_priority = p.priority(this);
		++p.peer_count;
		if (m_dirty) return;
		int new_priority = p.priority(this);
		if (prev_priority == new_priority) return;
		if (prev_priority == -1)
			add(index);
		else
			update(prev_priority, p.index);
	}